

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

Bool write_nrx4_reg(Emulator *e,Channel *channel,Address addr,u8 value,u16 max_length)

{
  byte bVar1;
  ushort uVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  ulong uVar4;
  undefined7 uVar5;
  Bool BVar6;
  undefined1 uVar7;
  
  uVar5 = (undefined7)((ulong)channel >> 8);
  uVar3 = CONCAT71(in_register_00000009,value) & 0xffffffff;
  uVar7 = channel->length_enabled != FALSE;
  channel->length_enabled = (Bool)(CONCAT71(in_register_00000009,value) >> 6) & TRUE;
  *(byte *)((long)&channel->frequency + 1) = value & 7;
  bVar1 = (e->state).apu.frame;
  uVar4 = (ulong)addr;
  if ((((value & 0x40) == 0 || (bVar1 & 1) != 0) || (bool)uVar7) || (channel->length == 0)) {
    if (-1 < (char)uVar3) goto LAB_00113241;
LAB_001131fc:
    if (channel->length == 0) {
      channel->length = max_length;
      if (channel->length_enabled != FALSE && (bVar1 & 1) == 0) {
        max_length = max_length - 1;
        channel->length = max_length;
      }
      HOOK_write_nrx4_trigger_new_length_abi
                (e,(char *)CONCAT71(uVar5,uVar7),uVar4,uVar3,(ulong)max_length);
    }
    if (channel->dac_enabled == FALSE) goto LAB_00113241;
    BVar6 = TRUE;
  }
  else {
    uVar2 = channel->length - 1;
    channel->length = uVar2;
    HOOK_write_nrx4_extra_length_clock_abi(e,(char *)CONCAT71(uVar5,uVar7),uVar4,uVar3,(ulong)uVar2)
    ;
    if ((char)uVar3 < '\0') goto LAB_001131fc;
    if (channel->length != 0) goto LAB_00113241;
    BVar6 = FALSE;
    HOOK_write_nrx4_disable_channel_ab(e,(char *)CONCAT71(uVar5,uVar7),uVar4,uVar3);
  }
  channel->status = BVar6;
LAB_00113241:
  HOOK_write_nrx4_info_abii
            (e,(char *)CONCAT71(uVar5,uVar7),uVar4,uVar3,uVar3 >> 7,(ulong)channel->length_enabled);
  return (Bool)(uVar3 >> 7);
}

Assistant:

static Bool write_nrx4_reg(Emulator* e, Channel* channel, Address addr,
                           u8 value, u16 max_length) {
  Bool trigger = UNPACK(value, NRX4_INITIAL);
  Bool was_length_enabled = channel->length_enabled;
  channel->length_enabled = UNPACK(value, NRX4_LENGTH_ENABLED);
  channel->frequency &= 0xff;
  channel->frequency |= UNPACK(value, NRX4_FREQUENCY_HI) << 8;

  /* Extra length clocking occurs on NRX4 writes if the next APU frame isn't a
   * length counter frame. This only occurs on transition from disabled to
   * enabled. */
  Bool next_frame_is_length = (APU.frame & 1) == 1;
  if (UNLIKELY(!was_length_enabled && channel->length_enabled &&
               !next_frame_is_length && channel->length > 0)) {
    channel->length--;
    HOOK(write_nrx4_extra_length_clock_abi, addr, value, channel->length);
    if (!trigger && channel->length == 0) {
      HOOK(write_nrx4_disable_channel_ab, addr, value);
      channel->status = FALSE;
    }
  }

  if (trigger) {
    if (channel->length == 0) {
      channel->length = max_length;
      if (channel->length_enabled && !next_frame_is_length) {
        channel->length--;
      }
      HOOK(write_nrx4_trigger_new_length_abi, addr, value, channel->length);
    }
    if (channel->dac_enabled) {
      channel->status = TRUE;
    }
  }

  HOOK(write_nrx4_info_abii, addr, value, trigger, channel->length_enabled);
  return trigger;
}